

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O0

int __thiscall OpaqueType::serialise(OpaqueType *this,uint8_t *buf,size_t max_len)

{
  uint8_t *ptr;
  int i;
  size_t max_len_local;
  uint8_t *buf_local;
  OpaqueType *this_local;
  
  this_local._4_4_ =
       BER_CONTAINER::serialise(&this->super_BER_CONTAINER,buf,max_len,(long)this->_dataLength);
  if (-1 < this_local._4_4_) {
    memcpy(buf + this_local._4_4_,this->_value,(long)this->_dataLength);
    this_local._4_4_ = ((int)(buf + this_local._4_4_) + this->_dataLength) - (int)buf;
  }
  return this_local._4_4_;
}

Assistant:

int OpaqueType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, _dataLength);
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;

    memcpy(ptr, _value, _dataLength);
    ptr += _dataLength;

    return ptr - buf;
}